

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall picojson::default_parse_context::set_bool(default_parse_context *this,bool b)

{
  undefined8 *puVar1;
  undefined1 uVar2;
  value local_20;
  
  local_20.type_ = 1;
  local_20.u_.boolean_ = b;
  value::operator=(this->out_,&local_20);
  uVar2 = local_20.u_.boolean_;
  if (local_20.type_ == 5) {
    if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)CONCAT71(local_20.u_._1_7_,local_20.u_.boolean_) ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) {
      return true;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)CONCAT71(local_20.u_._1_7_,local_20.u_.boolean_));
  }
  else if (local_20.type_ == 4) {
    if ((vector<picojson::value,_std::allocator<picojson::value>_> *)
        CONCAT71(local_20.u_._1_7_,local_20.u_.boolean_) ==
        (vector<picojson::value,_std::allocator<picojson::value>_> *)0x0) {
      return true;
    }
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)
               CONCAT71(local_20.u_._1_7_,local_20.u_.boolean_));
  }
  else {
    if (local_20.type_ != 3) {
      return true;
    }
    puVar1 = (undefined8 *)CONCAT71(local_20.u_._1_7_,local_20.u_.boolean_);
    if (puVar1 == (undefined8 *)0x0) {
      return true;
    }
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
  }
  operator_delete((void *)CONCAT71(local_20.u_._1_7_,uVar2));
  return true;
}

Assistant:

bool set_bool(bool b) {
      *out_ = value(b);
      return true;
    }